

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveEdge
          (GraphCycles *this,GraphId x,GraphId y)

{
  Node **ppNVar1;
  Node *pNVar2;
  NodeSet *pNVar3;
  uint32_t uVar4;
  Node *pNVar5;
  Node *pNVar6;
  
  ppNVar1 = (this->rep_->nodes_).ptr_;
  pNVar5 = ppNVar1[x.handle & 0xffffffff];
  if (pNVar5->version != (uint32_t)(x.handle >> 0x20)) {
    pNVar5 = (Node *)0x0;
  }
  pNVar2 = ppNVar1[y.handle & 0xffffffff];
  pNVar6 = (Node *)0x0;
  if (pNVar2->version == (uint32_t)(y.handle >> 0x20)) {
    pNVar6 = pNVar2;
  }
  if ((pNVar5 != (Node *)0x0) && (pNVar6 != (Node *)0x0)) {
    pNVar3 = (NodeSet *)(pNVar5->out).table_.ptr_;
    uVar4 = synchronization_internal::anon_unknown_0::NodeSet::FindIndex
                      (pNVar3,(pNVar5->out).table_.size_);
    if ((pNVar3->table_).space_[(ulong)uVar4 - 2] == (int)y.handle) {
      (pNVar3->table_).space_[(ulong)uVar4 - 2] = -2;
    }
    pNVar3 = (NodeSet *)(pNVar6->in).table_.ptr_;
    uVar4 = synchronization_internal::anon_unknown_0::NodeSet::FindIndex
                      (pNVar3,(pNVar6->in).table_.size_);
    if ((pNVar3->table_).space_[(ulong)uVar4 - 2] == (int)x.handle) {
      (pNVar3->table_).space_[(ulong)uVar4 - 2] = -2;
    }
  }
  return;
}

Assistant:

void GraphCycles::RemoveEdge(GraphId x, GraphId y) {
  Node* xn = FindNode(rep_, x);
  Node* yn = FindNode(rep_, y);
  if (xn && yn) {
    xn->out.erase(NodeIndex(y));
    yn->in.erase(NodeIndex(x));
    // No need to update the rank assignment since a previous valid
    // rank assignment remains valid after an edge deletion.
  }
}